

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3SubInt64(i64 *pA,i64 iB)

{
  i64 iB_local;
  i64 *pA_local;
  
  if (iB == -0x8000000000000000) {
    if (*pA < 0) {
      *pA = *pA + -0x8000000000000000;
      pA_local._4_4_ = 0;
    }
    else {
      pA_local._4_4_ = 1;
    }
  }
  else {
    pA_local._4_4_ = sqlite3AddInt64(pA,-iB);
  }
  return pA_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3SubInt64(i64 *pA, i64 iB){
#if GCC_VERSION>=5004000 && !defined(__INTEL_COMPILER)
  return __builtin_sub_overflow(*pA, iB, pA);
#else
  testcase( iB==SMALLEST_INT64+1 );
  if( iB==SMALLEST_INT64 ){
    testcase( (*pA)==(-1) ); testcase( (*pA)==0 );
    if( (*pA)>=0 ) return 1;
    *pA -= iB;
    return 0;
  }else{
    return sqlite3AddInt64(pA, -iB);
  }
#endif
}